

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<double,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  ArgMinMaxState<double,_double> *source_00;
  ArgMinMaxState<double,_double> *in_RCX;
  idx_t i;
  ArgMinMaxState<double,_double> **tdata;
  ArgMinMaxState<double,_double> **sdata;
  ArgMinMaxState<double,_double> *target_00;
  
  FlatVector::GetData<duckdb::ArgMinMaxState<double,double>const*>((Vector *)0x8cde62);
  source_00 = (ArgMinMaxState<double,_double> *)
              FlatVector::GetData<duckdb::ArgMinMaxState<double,double>*>((Vector *)0x8cde71);
  for (target_00 = (ArgMinMaxState<double,_double> *)0x0; target_00 < in_RCX;
      target_00 = (ArgMinMaxState<double,_double> *)&(target_00->super_ArgMinMaxStateBase).arg_null)
  {
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Combine<duckdb::ArgMinMaxState<double,double>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
              (source_00,target_00,(AggregateInputData *)0x8cdead);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}